

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lock.h
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::SequenceLock::Write
          (SequenceLock *this,atomic<unsigned_long> *dst,void *src,size_t size)

{
  ulong uVar1;
  int64_t orig_seq;
  size_t size_local;
  void *src_local;
  atomic<unsigned_long> *dst_local;
  SequenceLock *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->lock_).super___atomic_base<long>._M_i;
  if ((uVar1 & 1) == 0) {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (this->lock_).super___atomic_base<long>._M_i = uVar1 + 1;
    RelaxedCopyToAtomic(dst,src,size);
    std::operator&(memory_order_release,__memory_order_mask);
    (this->lock_).super___atomic_base<long>._M_i = uVar1 + 2;
    return;
  }
  __assert_fail("(orig_seq & 1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                ,0x69,
                "void absl::flags_internal::SequenceLock::Write(std::atomic<uint64_t> *, const void *, size_t)"
               );
}

Assistant:

void Write(std::atomic<uint64_t>* dst, const void* src, size_t size) {
    // We can use relaxed instructions to increment the counter since we
    // are extenally synchronized. The std::atomic_thread_fence below
    // ensures that the counter updates don't get interleaved with the
    // copy to the data.
    int64_t orig_seq = lock_.load(std::memory_order_relaxed);
    assert((orig_seq & 1) == 0);  // Must be initially unlocked.
    lock_.store(orig_seq + 1, std::memory_order_relaxed);

    // We put a release fence between update to lock_ and writes to shared data.
    // Thus all stores to shared data are effectively release operations and
    // update to lock_ above cannot be re-ordered past any of them. Note that
    // this barrier is not for the fetch_add above.  A release barrier for the
    // fetch_add would be before it, not after.
    std::atomic_thread_fence(std::memory_order_release);
    RelaxedCopyToAtomic(dst, src, size);
    // "Release" semantics ensure that none of the writes done by
    // RelaxedCopyToAtomic() can be reordered after the following modification.
    lock_.store(orig_seq + 2, std::memory_order_release);
  }